

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O2

int32_t ucol_getRulesEx_63(UCollator *coll,UColRuleOption delta,UChar *buffer,int32_t bufferLen)

{
  RuleBasedCollator *this;
  UErrorCode errorCode;
  UnicodeString rules;
  Char16Ptr local_80;
  UChar *local_78;
  UErrorCode local_64;
  UnicodeString local_60;
  
  local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  this = icu_63::RuleBasedCollator::rbcFromUCollator(coll);
  if (coll == (UCollator *)0x0 || this != (RuleBasedCollator *)0x0) {
    icu_63::RuleBasedCollator::getRules(this,delta,&local_60);
  }
  if (bufferLen < 1 || buffer == (UChar *)0x0) {
    if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
      local_60.fUnion.fFields.fLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
  }
  else {
    local_64 = U_ZERO_ERROR;
    local_80.p_ = buffer;
    local_60.fUnion.fFields.fLength =
         icu_63::UnicodeString::extract(&local_60,&local_80,bufferLen,&local_64);
    local_78 = local_80.p_;
  }
  icu_63::UnicodeString::~UnicodeString(&local_60);
  return local_60.fUnion.fFields.fLength;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getRulesEx(const UCollator *coll, UColRuleOption delta, UChar *buffer, int32_t bufferLen) {
    UnicodeString rules;
    const RuleBasedCollator *rbc = RuleBasedCollator::rbcFromUCollator(coll);
    if(rbc != NULL || coll == NULL) {
        rbc->getRules(delta, rules);
    }
    if(buffer != NULL && bufferLen > 0) {
        UErrorCode errorCode = U_ZERO_ERROR;
        return rules.extract(buffer, bufferLen, errorCode);
    } else {
        return rules.length();
    }
}